

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O0

int fullpacket(LIBSSH2_SESSION *session,int encrypted)

{
  int iVar1;
  bool local_8a;
  bool local_89;
  size_t local_88;
  size_t data_len;
  uchar *data;
  int compressed;
  int rc;
  transportpacket *p;
  uchar macbuf [64];
  int encrypted_local;
  LIBSSH2_SESSION *session_local;
  
  _compressed = &session->packet;
  if (session->fullpacket_state == libssh2_NB_state_idle) {
    session->fullpacket_macstate = 0;
    session->fullpacket_payload_len = (ulong)((session->packet).packet_length - 1);
    if (encrypted != 0) {
      (*((session->remote).mac)->hash)
                (session,(uchar *)&p,(session->remote).seqno,(session->packet).init,5,
                 (session->packet).payload,(uint32_t)session->fullpacket_payload_len,
                 &(session->remote).mac_abstract);
      iVar1 = memcmp(&p,_compressed->payload + session->fullpacket_payload_len,
                     (long)((session->remote).mac)->mac_len);
      if (iVar1 != 0) {
        session->fullpacket_macstate = -1;
      }
    }
    (session->remote).seqno = (session->remote).seqno + 1;
    session->fullpacket_payload_len =
         session->fullpacket_payload_len - (ulong)_compressed->padding_length;
    local_89 = false;
    if (((session->local).comp != (LIBSSH2_COMP_METHOD *)0x0) &&
       (local_89 = false, ((session->local).comp)->compress != 0)) {
      local_8a = true;
      if ((session->state & 4U) == 0) {
        local_8a = ((session->local).comp)->use_in_auth != 0;
      }
      local_89 = local_8a;
    }
    data._0_4_ = (uint)local_89;
    if (((uint)data != 0) && ((session->remote).comp_abstract != (void *)0x0)) {
      data._4_4_ = (*((session->remote).comp)->decomp)
                             (session,(uchar **)&data_len,&local_88,40000,_compressed->payload,
                              session->fullpacket_payload_len,&(session->remote).comp_abstract);
      (*session->free)(_compressed->payload,&session->abstract);
      if (data._4_4_ != 0) {
        return data._4_4_;
      }
      _compressed->payload = (uchar *)data_len;
      session->fullpacket_payload_len = local_88;
    }
    session->fullpacket_packet_type = (uint)*_compressed->payload;
    session->fullpacket_state = libssh2_NB_state_created;
  }
  if (session->fullpacket_state == libssh2_NB_state_created) {
    iVar1 = _libssh2_packet_add(session,_compressed->payload,session->fullpacket_payload_len,
                                session->fullpacket_macstate);
    if (iVar1 == -0x25) {
      return -0x25;
    }
    if (iVar1 != 0) {
      session->fullpacket_state = libssh2_NB_state_idle;
      return iVar1;
    }
  }
  session->fullpacket_state = libssh2_NB_state_idle;
  return session->fullpacket_packet_type;
}

Assistant:

static int
fullpacket(LIBSSH2_SESSION * session, int encrypted /* 1 or 0 */ )
{
    unsigned char macbuf[MAX_MACSIZE];
    struct transportpacket *p = &session->packet;
    int rc;
    int compressed;

    if(session->fullpacket_state == libssh2_NB_state_idle) {
        session->fullpacket_macstate = LIBSSH2_MAC_CONFIRMED;
        session->fullpacket_payload_len = p->packet_length - 1;

        if(encrypted) {

            /* Calculate MAC hash */
            session->remote.mac->hash(session, macbuf,  /* store hash here */
                                      session->remote.seqno,
                                      p->init, 5,
                                      p->payload,
                                      session->fullpacket_payload_len,
                                      &session->remote.mac_abstract);

            /* Compare the calculated hash with the MAC we just read from
             * the network. The read one is at the very end of the payload
             * buffer. Note that 'payload_len' here is the packet_length
             * field which includes the padding but not the MAC.
             */
            if(memcmp(macbuf, p->payload + session->fullpacket_payload_len,
                       session->remote.mac->mac_len)) {
                session->fullpacket_macstate = LIBSSH2_MAC_INVALID;
            }
        }

        session->remote.seqno++;

        /* ignore the padding */
        session->fullpacket_payload_len -= p->padding_length;

        /* Check for and deal with decompression */
        compressed =
            session->local.comp != NULL &&
            session->local.comp->compress &&
            ((session->state & LIBSSH2_STATE_AUTHENTICATED) ||
             session->local.comp->use_in_auth);

        if(compressed && session->remote.comp_abstract) {
            /*
             * The buffer for the decompression (remote.comp_abstract) is
             * initialised in time when it is needed so as long it is NULL we
             * cannot decompress.
             */

            unsigned char *data;
            size_t data_len;
            rc = session->remote.comp->decomp(session,
                                              &data, &data_len,
                                              LIBSSH2_PACKET_MAXDECOMP,
                                              p->payload,
                                              session->fullpacket_payload_len,
                                              &session->remote.comp_abstract);
            LIBSSH2_FREE(session, p->payload);
            if(rc)
                return rc;

            p->payload = data;
            session->fullpacket_payload_len = data_len;
        }

        session->fullpacket_packet_type = p->payload[0];

        debugdump(session, "libssh2_transport_read() plain",
                  p->payload, session->fullpacket_payload_len);

        session->fullpacket_state = libssh2_NB_state_created;
    }

    if(session->fullpacket_state == libssh2_NB_state_created) {
        rc = _libssh2_packet_add(session, p->payload,
                                 session->fullpacket_payload_len,
                                 session->fullpacket_macstate);
        if(rc == LIBSSH2_ERROR_EAGAIN)
            return rc;
        if(rc) {
            session->fullpacket_state = libssh2_NB_state_idle;
            return rc;
        }
    }

    session->fullpacket_state = libssh2_NB_state_idle;

    return session->fullpacket_packet_type;
}